

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QString>::insert
          (QMovableArrayOps<QString> *this,qsizetype i,qsizetype n,parameter_type t)

{
  QString **ppQVar1;
  qsizetype *pqVar2;
  QArrayData *pQVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  long lVar6;
  QString *pQVar7;
  qsizetype inserts;
  bool bVar8;
  
  pQVar3 = &((t->d).d)->super_QArrayData;
  pcVar4 = (t->d).ptr;
  qVar5 = (t->d).size;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar8 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size != 0;
  QArrayDataPointer<QString>::detachAndGrow
            ((QArrayDataPointer<QString> *)this,(uint)(i == 0 && bVar8),n,(QString **)0x0,
             (QArrayDataPointer<QString> *)0x0);
  if (i == 0 && bVar8) {
    for (; n != 0; n = n + -1) {
      pQVar7 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr;
      pQVar7[-1].d.d = (Data *)pQVar3;
      pQVar7[-1].d.ptr = pcVar4;
      pQVar7[-1].d.size = qVar5;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ppQVar1 = &(this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size;
      *pqVar2 = *pqVar2 + 1;
    }
  }
  else {
    pQVar7 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr + i;
    memmove(pQVar7 + n,pQVar7,
            ((this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size - i) *
            0x18);
    lVar6 = n;
    if (n != 0) {
      do {
        (pQVar7->d).d = (Data *)pQVar3;
        (pQVar7->d).ptr = pcVar4;
        (pQVar7->d).size = qVar5;
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        lVar6 = lVar6 + -1;
        pQVar7 = pQVar7 + 1;
      } while (lVar6 != 0);
    }
    pqVar2 = &(this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size;
    *pqVar2 = *pqVar2 + n;
  }
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }